

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteIntroduction
          (ReflectionClassGenerator *this,Printer *printer)

{
  string *value1;
  string local_40;
  
  io::Printer::Print(printer,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $file_name$\n#pragma warning disable 1591, 0612, 3021\n#region Designer generated code\n\nusing pb = global::Google.Protobuf;\nusing pbc = global::Google.Protobuf.Collections;\nusing pbr = global::Google.Protobuf.Reflection;\nusing scg = global::System.Collections.Generic;\n"
                     ,"file_name",*(string **)this->file_);
  if ((this->namespace_)._M_string_length != 0) {
    io::Printer::Print(printer,"namespace $namespace$ {\n","namespace",&this->namespace_);
    io::Printer::Indent(printer);
    io::Printer::Print(printer,"\n");
  }
  value1 = *(string **)this->file_;
  SourceGeneratorBase::class_access_level_abi_cxx11_(&local_40,&this->super_SourceGeneratorBase);
  io::Printer::Print(printer,
                     "/// <summary>Holder for reflection information generated from $file_name$</summary>\n$access_level$ static partial class $reflection_class_name$ {\n\n"
                     ,"file_name",value1,"access_level",&local_40,"reflection_class_name",
                     &this->reflectionClassname_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Indent(printer);
  return;
}

Assistant:

void ReflectionClassGenerator::WriteIntroduction(io::Printer* printer) {
  printer->Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $file_name$\n"
    "#pragma warning disable 1591, 0612, 3021\n"
    "#region Designer generated code\n"
    "\n"
    "using pb = global::Google.Protobuf;\n"
    "using pbc = global::Google.Protobuf.Collections;\n"
    "using pbr = global::Google.Protobuf.Reflection;\n"
    "using scg = global::System.Collections.Generic;\n",
    "file_name", file_->name());

  if (!namespace_.empty()) {
    printer->Print("namespace $namespace$ {\n", "namespace", namespace_);
    printer->Indent();
    printer->Print("\n");
  }

  printer->Print(
    "/// <summary>Holder for reflection information generated from $file_name$</summary>\n"
    "$access_level$ static partial class $reflection_class_name$ {\n"
    "\n",
    "file_name", file_->name(),
    "access_level", class_access_level(),
    "reflection_class_name", reflectionClassname_);
  printer->Indent();
}